

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_ReplaceChannel(ReplaceChannelForm1 ReplaceChannel)

{
  uint8_t uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  ImageTemplate<unsigned_char> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  Image local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  Unit_Test::intensityArray(&local_70,2);
  uVar1 = *local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_98,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_58,uVar1,0,0,&local_98);
  local_98._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_98);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&local_98,local_58._width,local_58._height,'\x03','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            (&local_98,
             local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  uVar4 = rand();
  (*ReplaceChannel)(&local_58,&local_98,(uint8_t)(uVar4 % 3));
  puVar2 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(3);
  local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 3;
  uVar1 = puVar2[1];
  local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = uVar1;
  *(ushort *)
   local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = CONCAT11(uVar1,uVar1);
  local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[uVar4 % 3] =
       *local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar3 = Unit_Test::verifyImage(&local_98,&local_30,false);
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_98._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_98);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool form1_ReplaceChannel(ReplaceChannelForm1 ReplaceChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input = uniformImage( intensity[0] );
        PenguinV_Image::Image output( input.width(), input.height(), PenguinV_Image::RGB );

        output.fill( intensity[1] );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        ReplaceChannel( input, output, channelId );

        std::vector<uint8_t> verificationArray( 3, intensity[1] );
        verificationArray[channelId] = intensity[0];

        return verifyImage( output, verificationArray, false );
    }